

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O2

void __thiscall
Assimp::FBX::Node::AddChild<aiMatrix4x4t<float>>(Node *this,string *name,aiMatrix4x4t<float> more)

{
  undefined1 auStack_b8 [112];
  aiMatrix4x4t<float> local_48;
  
  Node((Node *)auStack_b8,name);
  local_48.d1 = more.d1;
  local_48.d2 = more.d2;
  local_48.d3 = more.d3;
  local_48.d4 = more.d4;
  local_48.c1 = more.c1;
  local_48.c2 = more.c2;
  local_48.c3 = more.c3;
  local_48.c4 = more.c4;
  local_48.b1 = more.b1;
  local_48.b2 = more.b2;
  local_48.b3 = more.b3;
  local_48.b4 = more.b4;
  local_48.a1 = more.a1;
  local_48.a2 = more.a2;
  local_48.a3 = more.a3;
  local_48.a4 = more.a4;
  std::vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>::
  emplace_back<aiMatrix4x4t<float>&>
            ((vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>
              *)(auStack_b8 + 0x20),&local_48);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
            (&this->children,(value_type *)auStack_b8);
  ~Node((Node *)auStack_b8);
  return;
}

Assistant:

void AddChild(
        const std::string& name,
        More... more
    ) {
        FBX::Node c(name);
        c.AddProperties(more...);
        children.push_back(c);
    }